

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  thread logicThread;
  Timer timy;
  Timer timx;
  App app;
  MySimulator sim;
  thread tStack_1f8;
  App *local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  Timer local_1d8;
  Timer local_1c0;
  App local_1a8;
  MySimulator local_138;
  
  local_1c0.isRunning = false;
  local_1c0.prescaler = 0;
  local_1c0.period = 0;
  local_1d8.isRunning = false;
  local_1d8.prescaler = 0;
  local_1d8.period = 0;
  local_1c0.cb = timxCallback;
  local_1d8.cb = timyCallback;
  brown::MySimulator::MySimulator(&local_138,&local_1c0,&local_1d8);
  brown::App::App(&local_1a8,&local_138.super_Simulator,userInit,userLoop);
  local_1e8 = brown::App::runLogic;
  local_1e0 = 0;
  local_1f0 = &local_1a8;
  std::thread::thread<int(brown::App::*)(),brown::App*,void>
            (&tStack_1f8,(type *)&local_1e8,&local_1f0);
  iVar1 = brown::App::runGraphics(&local_1a8);
  std::thread::join();
  std::thread::~thread(&tStack_1f8);
  brown::App::~App(&local_1a8);
  brown::Simulator::~Simulator(&local_138.super_Simulator);
  return iVar1;
}

Assistant:

int main(int argc, const char * argv[]) {
    brown::Timer timx(timxCallback);
    brown::Timer timy(timyCallback);
    brown::MySimulator sim(timx, timy);
    brown::App app(sim, userInit, userLoop);
    std::thread logicThread(&brown::App::runLogic, &app);
    int retCode = app.runGraphics();
    logicThread.join();
    return retCode;
}